

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O2

void __thiscall
enact::ParametricTypename::ParametricTypename
          (ParametricTypename *this,ParametricTypename *typename_)

{
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *cloneables;
  pointer *__ptr;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_48;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_40;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  local_38;
  
  (*((typename_->m_constructorTypename)._M_t.
     super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
     super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
     super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[2])
            (&local_40);
  local_48._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (Typename *)0x0;
  cloneAll<enact::Typename_const>(&local_38,(enact *)&typename_->m_parameterTypenames,cloneables);
  ParametricTypename(this,(unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                           *)&local_48,&local_38);
  std::
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ::~vector(&local_38);
  if (local_48._M_head_impl != (Typename *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Typename[1])();
  }
  if (local_40._M_head_impl != (Typename *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Typename[1])();
  }
  return;
}

Assistant:

ParametricTypename::ParametricTypename(const ParametricTypename &typename_) :
            ParametricTypename{
                    typename_.m_constructorTypename->clone(),
                    cloneAll(typename_.m_parameterTypenames)} {
    }